

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSplitter::SetCurrentChannel(ImDrawListSplitter *this,ImDrawList *draw_list,int idx)

{
  bool bVar1;
  undefined8 *puVar2;
  long lVar3;
  int in_EDX;
  undefined8 *in_RSI;
  int *in_RDI;
  
  bVar1 = false;
  if (-1 < in_EDX) {
    bVar1 = in_EDX < in_RDI[1];
  }
  if (bVar1) {
    if (*in_RDI != in_EDX) {
      puVar2 = (undefined8 *)(*(long *)(in_RDI + 4) + (long)*in_RDI * 0x20);
      *puVar2 = *in_RSI;
      puVar2[1] = in_RSI[1];
      lVar3 = *(long *)(in_RDI + 4) + (long)*in_RDI * 0x20;
      *(undefined8 *)(lVar3 + 0x10) = in_RSI[2];
      *(undefined8 *)(lVar3 + 0x18) = in_RSI[3];
      *in_RDI = in_EDX;
      puVar2 = (undefined8 *)(*(long *)(in_RDI + 4) + (long)in_EDX * 0x20);
      *in_RSI = *puVar2;
      in_RSI[1] = puVar2[1];
      lVar3 = *(long *)(in_RDI + 4) + (long)in_EDX * 0x20;
      in_RSI[2] = *(undefined8 *)(lVar3 + 0x10);
      in_RSI[3] = *(undefined8 *)(lVar3 + 0x18);
      in_RSI[0xb] = in_RSI[3] + (long)*(int *)(in_RSI + 2) * 4;
    }
    return;
  }
  __assert_fail("idx >= 0 && idx < _Count",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                ,0x585,"void ImDrawListSplitter::SetCurrentChannel(ImDrawList *, int)");
}

Assistant:

void ImDrawListSplitter::SetCurrentChannel(ImDrawList* draw_list, int idx)
{
    IM_ASSERT(idx >= 0 && idx < _Count);
    if (_Current == idx)
        return;
    // Overwrite ImVector (12/16 bytes), four times. This is merely a silly optimization instead of doing .swap()
    memcpy(&_Channels.Data[_Current]._CmdBuffer, &draw_list->CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&_Channels.Data[_Current]._IdxBuffer, &draw_list->IdxBuffer, sizeof(draw_list->IdxBuffer));
    _Current = idx;
    memcpy(&draw_list->CmdBuffer, &_Channels.Data[idx]._CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&draw_list->IdxBuffer, &_Channels.Data[idx]._IdxBuffer, sizeof(draw_list->IdxBuffer));
    draw_list->_IdxWritePtr = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size;
}